

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O1

void __thiscall storage::BTree::print(BTree *this)

{
  BTNode *pBVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  BTNode **__args;
  char *pcVar7;
  queue<storage::BTNode_*,_std::deque<storage::BTNode_*,_std::allocator<storage::BTNode_*>_>_> queue
  ;
  _Deque_base<storage::BTNode_*,_std::allocator<storage::BTNode_*>_> local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<storage::BTNode_*,_std::allocator<storage::BTNode_*>_>::_M_initialize_map
            (&local_88,0);
  if (this->root_ != (BTNode *)0x0) {
    if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<storage::BTNode*,std::allocator<storage::BTNode*>>::
      _M_push_back_aux<storage::BTNode*const&>
                ((deque<storage::BTNode*,std::allocator<storage::BTNode*>> *)&local_88,&this->root_)
      ;
    }
    else {
      *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = this->root_;
      local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
  }
  while( true ) {
    while( true ) {
      if (((long)local_88._M_impl.super__Deque_impl_data._M_start._M_last -
           (long)local_88._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
          ((long)local_88._M_impl.super__Deque_impl_data._M_finish._M_cur -
           (long)local_88._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
          ((((ulong)((long)local_88._M_impl.super__Deque_impl_data._M_finish._M_node -
                    (long)local_88._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (ulong)(local_88._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
          0x40 == 0) {
        std::_Deque_base<storage::BTNode_*,_std::allocator<storage::BTNode_*>_>::~_Deque_base
                  (&local_88);
        return;
      }
      pBVar1 = *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_88._M_impl.super__Deque_impl_data._M_start._M_last =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
        local_88._M_impl.super__Deque_impl_data._M_start._M_first =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_88._M_impl.super__Deque_impl_data._M_start._M_node =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      iVar2 = (**pBVar1->_vptr_BTNode)(pBVar1);
      if ((char)iVar2 == '\0') break;
      putchar(0x28);
      uVar3 = (ulong)(uint)pBVar1->used_links_count_;
      if (1 < pBVar1->used_links_count_) {
        uVar5 = 0;
        do {
          pcVar7 = "%d";
          if (uVar5 != (int)uVar3 - 2) {
            pcVar7 = "%d,";
          }
          printf(pcVar7,(ulong)(uint)pBVar1->keys_[uVar5]);
          uVar5 = uVar5 + 1;
          uVar3 = (ulong)pBVar1->used_links_count_;
        } while ((long)uVar5 < (long)(uVar3 - 1));
      }
      putchar(0x29);
      lVar4 = __dynamic_cast(pBVar1,&BTNode::typeinfo,&BTLeafNode::typeinfo,0);
      if (*(long *)(lVar4 + 0x270) != 0) {
        printf("->");
      }
    }
    lVar4 = __dynamic_cast(pBVar1,&BTNode::typeinfo,&BTInnerNode::typeinfo,0);
    if (lVar4 == 0) break;
    putchar(0x5b);
    uVar3 = (ulong)*(uint *)(lVar4 + 0xdc);
    if (1 < (int)*(uint *)(lVar4 + 0xdc)) {
      uVar5 = 0;
      do {
        pcVar7 = "%d";
        if (uVar5 != (int)uVar3 - 2) {
          pcVar7 = "%d,";
        }
        printf(pcVar7,(ulong)*(uint *)(lVar4 + 0x14 + uVar5 * 4));
        uVar5 = uVar5 + 1;
        uVar3 = (ulong)*(int *)(lVar4 + 0xdc);
      } while ((long)uVar5 < (long)(uVar3 - 1));
    }
    putchar(0x5d);
    if (0 < *(int *)(lVar4 + 0xdc)) {
      __args = (BTNode **)(lVar4 + 0xe0);
      lVar6 = 0;
      do {
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<storage::BTNode*,std::allocator<storage::BTNode*>>::
          _M_push_back_aux<storage::BTNode*const&>
                    ((deque<storage::BTNode*,std::allocator<storage::BTNode*>> *)&local_88,__args);
        }
        else {
          *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = *__args;
          local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
        lVar6 = lVar6 + 1;
        __args = __args + 1;
      } while (lVar6 < *(int *)(lVar4 + 0xdc));
    }
    if ((*(long *)(lVar4 + 8) == 0) ||
       (*(int *)(lVar4 + 0x10) == *(int *)(*(long *)(lVar4 + 8) + 0xdc) + -1)) {
      putchar(10);
    }
  }
  __assert_fail("nd",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                ,0x133,"void storage::BTree::print()");
}

Assistant:

void BTree::print() {
        std::queue<BTNode*> queue;
        if (root_)
            queue.push(root_);
        while (queue.size() > 0)
        {
            BTNode* node = queue.front();
            queue.pop();
            if (!node->is_leaf_node())
            {
                auto nd = dynamic_cast<BTInnerNode*>(node);
                assert(nd);
                printf("[");
                for (int i = 0; i < nd->key_count(); ++i)
                {
                    if (i == nd->key_count() - 1)
                    {
                        printf("%d", nd->keys_[i]);
                    }
                    else
                    {
                        printf("%d,", nd->keys_[i]);
                    }
                }
                printf("]");
                for (int i = 0; i < nd->used_links_count_; ++i)
                    queue.push(nd->links_[i]);
                if (!nd->parent_ || nd->child_index_ == nd->parent_->used_links_count_ - 1)
                {
                    printf("\n");
                }
            }
            else
            {
                printf("(");
                for (int i = 0; i < node->key_count(); ++i)
                {
                    if (i == node->key_count() - 1)
                    {
                        printf("%d", node->keys_[i]);
                    }
                    else
                    {
                        printf("%d,", node->keys_[i]);
                    }
                }
                printf(")");
                if (dynamic_cast<BTLeafNode*>(node)->next_)
                    printf("->");
            }
        }
    }